

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O1

bool brynet::net::WebSocketFormat::wsFrameExtractBuffer
               (char *inbuffer,size_t bufferSize,string *payload,WebSocketFrameType *outopcode,
               size_t *frameSize,bool *outfin)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint8_t mask [4];
  
  if (bufferSize < 2) {
    return false;
  }
  *outfin = (bool)((byte)*inbuffer >> 7);
  *outopcode = (byte)*inbuffer & 0xf;
  bVar1 = inbuffer[1];
  uVar5 = bVar1 & 0x7f;
  if (uVar5 == 0x7e) {
    if (bufferSize < 4) {
      return false;
    }
    uVar5 = (uint)(byte)inbuffer[2] << 8;
    uVar2 = 4;
    lVar4 = 3;
  }
  else {
    uVar2 = 2;
    if ((char)uVar5 != '\x7f') goto LAB_001348d7;
    if (bufferSize < 10) {
      return false;
    }
    if (inbuffer[2] != '\0') {
      return false;
    }
    if (inbuffer[3] != '\0') {
      return false;
    }
    if (inbuffer[4] != '\0') {
      return false;
    }
    if (inbuffer[5] != '\0') {
      return false;
    }
    if (inbuffer[6] < '\0') {
      return false;
    }
    uVar5 = (uint)(byte)inbuffer[8] << 8 |
            (uint)(byte)inbuffer[7] << 0x10 | (int)inbuffer[6] << 0x18;
    uVar2 = 10;
    lVar4 = 9;
  }
  uVar5 = (byte)inbuffer[lVar4] | uVar5;
LAB_001348d7:
  if (((-1 < (char)bVar1) || (uVar2 = (ulong)((int)uVar2 + 4), uVar2 <= bufferSize)) &&
     (uVar3 = (ulong)((int)uVar2 + uVar5), uVar3 <= bufferSize)) {
    if ((char)bVar1 < '\0') {
      std::__cxx11::string::reserve((ulong)payload);
      if (uVar5 != 0) {
        uVar2 = 0;
        do {
          std::__cxx11::string::push_back((char)payload);
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
      }
    }
    else {
      std::__cxx11::string::append((char *)payload,(ulong)(inbuffer + uVar2));
    }
    *frameSize = uVar3;
    return true;
  }
  return false;
}

Assistant:

static bool wsFrameExtractBuffer(const char* inbuffer, 
                const size_t bufferSize, 
                std::string& payload, 
                WebSocketFrameType& outopcode, 
                size_t& frameSize, 
                bool& outfin)
            {
                const unsigned char* buffer = (const unsigned char*)inbuffer;

                if (bufferSize < 2)
                {
                    return false;
                }

                outfin = (buffer[0] & 0x80) != 0;
                outopcode = (WebSocketFrameType)(buffer[0] & 0x0F);
                const bool isMasking = (buffer[1] & 0x80) != 0;
                uint32_t payloadlen = buffer[1] & 0x7F;

                uint32_t pos = 2;
                if (payloadlen == 126)
                {
                    if (bufferSize < 4)
                    {
                        return false;
                    }

                    payloadlen = (buffer[2] << 8) + buffer[3];
                    pos = 4;
                }
                else if (payloadlen == 127)
                {
                    if (bufferSize < 10)
                    {
                        return false;
                    }

                    if (buffer[2] != 0 ||
                        buffer[3] != 0 ||
                        buffer[4] != 0 ||
                        buffer[5] != 0)
                    {
                        return false;
                    }

                    if ((buffer[6] & 0x80) != 0)
                    {
                        return false;
                    }

                    payloadlen = (buffer[6] << 24) + (buffer[7] << 16) + (buffer[8] << 8) + buffer[9];
                    pos = 10;
                }

                uint8_t mask[4];
                if (isMasking)
                {
                    if (bufferSize < (pos + 4))
                    {
                        return false;
                    }

                    mask[0] = buffer[pos++];
                    mask[1] = buffer[pos++];
                    mask[2] = buffer[pos++];
                    mask[3] = buffer[pos++];
                }

                if (bufferSize < (pos + payloadlen))
                {
                    return false;
                }

                if (isMasking)
                {
                    payload.reserve(payloadlen);
                    for (size_t i = pos, j = 0; j < payloadlen; i++, j++)
                        payload.push_back(buffer[i] ^ mask[j % 4]);
                }
                else
                {
                    payload.append((const char*)(buffer + pos), payloadlen);
                }

                frameSize = payloadlen + pos;

                return true;
            }